

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArray::SetHeadAndLastUsedSegment
          (JavascriptArray *this,SparseArraySegmentBase *segment)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  DynamicObjectFlags DVar4;
  undefined4 *puVar5;
  
  DVar4 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  if ((DVar4 & HasSegmentMap) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa3a,"(!HasSegmentMap())","!HasSegmentMap()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  Memory::Recycler::WBSetBit((char *)&this->segmentUnion);
  this->segmentUnion = (Type)segment;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->segmentUnion);
  TVar1 = this->segmentUnion;
  Memory::Recycler::WBSetBit((char *)&this->head);
  (this->head).ptr = (SparseArraySegmentBase *)TVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->head);
  return;
}

Assistant:

void JavascriptArray::SetHeadAndLastUsedSegment(SparseArraySegmentBase * segment)
    {

        Assert(!HasSegmentMap());
        this->head = this->segmentUnion.lastUsedSegment = segment;
    }